

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week5-app1.cpp
# Opt level: O0

void __thiscall Vector<Date>::Vector(Vector<Date> *this,int N)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  Date *pDVar4;
  Date *local_68;
  Date local_34;
  int local_28;
  int i;
  int local_14;
  Vector<Date> *pVStack_10;
  int N_local;
  Vector<Date> *this_local;
  
  this->N = N;
  uVar2 = (ulong)N;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(0xc),0);
  if (SUB168(auVar1 * ZEXT816(0xc),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  local_14 = N;
  pVStack_10 = this;
  pDVar4 = (Date *)operator_new__(uVar3);
  if (uVar2 != 0) {
    local_68 = pDVar4;
    do {
      Date::Date(local_68);
      local_68 = local_68 + 1;
    } while (local_68 != pDVar4 + uVar2);
  }
  this->values = pDVar4;
  for (local_28 = 0; local_28 < local_14; local_28 = local_28 + 1) {
    Date::Date(&local_34,0);
    pDVar4 = this->values + local_28;
    pDVar4->year = local_34.year;
    pDVar4->month = local_34.month;
    pDVar4->day = local_34.day;
  }
  return;
}

Assistant:

Vector(int N) : N(N), values(new T[N])
    {
        for(auto i=0; i<N; ++i)
            values[i] = 0;
    }